

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADASaxFWLColladaParserAutoGen14Private.cpp
# Opt level: O1

bool __thiscall
COLLADASaxFWL14::ColladaParserAutoGen14Private::_preEnd__profile_GLSL__technique__pass__fog_mode
          (ColladaParserAutoGen14Private *this)

{
  return true;
}

Assistant:

bool ColladaParserAutoGen14Private::_preEnd__profile_GLSL__technique__pass__fog_mode()
{
#ifdef GENERATEDSAXPARSER_VALIDATION
    if ( mValidate )
    {

        bool validationResult = _validateEnd__profile_GLSL__technique__pass__fog_mode();
        if ( !validationResult ) return false;

    } // validation
#endif

    return true;
}